

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O2

DWORD GetEnvironmentVariableW(LPCWSTR lpName,LPWSTR lpBuffer,DWORD nSize)

{
  int iVar1;
  DWORD DVar2;
  LPCSTR lpMultiByteStr;
  LPSTR local_38;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0013154a;
  iVar1 = WideCharToMultiByte(0,0,lpName,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
  if (iVar1 == 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013154a;
    DVar2 = 0x57;
LAB_001314be:
    SetLastError(DVar2);
    local_38 = (LPSTR)0x0;
    lpMultiByteStr = (LPCSTR)0x0;
LAB_001314c9:
    DVar2 = 0;
  }
  else {
    lpMultiByteStr = (LPCSTR)PAL_malloc((long)iVar1);
    if (lpMultiByteStr == (LPCSTR)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013154a;
      DVar2 = 8;
      goto LAB_001314be;
    }
    if (nSize != 0) {
      local_38 = (LPSTR)PAL_malloc((ulong)(nSize * 2));
      if (local_38 != (LPSTR)0x0) goto LAB_001314fc;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013154a;
      SetLastError(8);
      local_38 = (LPSTR)0x0;
      goto LAB_001314c9;
    }
    local_38 = (LPSTR)0x0;
LAB_001314fc:
    DVar2 = 0;
    iVar1 = WideCharToMultiByte(0,0,lpName,-1,lpMultiByteStr,iVar1,(LPCSTR)0x0,(LPBOOL)0x0);
    if (iVar1 == 0) {
      fprintf(_stderr,"] %s %s:%d","GetEnvironmentVariableW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/environ.cpp"
              ,0xb6);
      fprintf(_stderr,"WideCharToMultiByte failed!\n");
      SetLastError(0x54f);
    }
    else {
      DVar2 = GetEnvironmentVariableA(lpMultiByteStr,local_38,nSize);
      if (nSize < DVar2) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013154a;
      }
      else {
        if (DVar2 == 0) goto LAB_001314c9;
        DVar2 = 0;
        iVar1 = MultiByteToWideChar(0,0,local_38,-1,lpBuffer,nSize);
        if (iVar1 == 0) {
          fprintf(_stderr,"] %s %s:%d","GetEnvironmentVariableW",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/environ.cpp"
                  ,0xcd);
          fprintf(_stderr,"MultiByteToWideChar failed!\n");
          SetLastError(0x54f);
          *lpBuffer = L'\0';
        }
        else {
          DVar2 = iVar1 - 1;
        }
      }
    }
  }
  PAL_free(local_38);
  PAL_free(lpMultiByteStr);
  if (PAL_InitializeChakraCoreCalled != false) {
    return DVar2;
  }
LAB_0013154a:
  abort();
}

Assistant:

DWORD
PALAPI
GetEnvironmentVariableW(
            IN LPCWSTR lpName,
            OUT LPWSTR lpBuffer,
            IN DWORD nSize)
{
    CHAR *inBuff = NULL;
    CHAR *outBuff = NULL;
    INT inBuffSize;
    DWORD size = 0;

    PERF_ENTRY(GetEnvironmentVariableW);
    ENTRY("GetEnvironmentVariableW(lpName=%p (%S), lpBuffer=%p, nSize=%u)\n",
          lpName?lpName:W16_NULLSTRING,
          lpName?lpName:W16_NULLSTRING, lpBuffer, nSize);

    inBuffSize = WideCharToMultiByte( CP_ACP, 0, lpName, -1, 
                                      inBuff, 0, NULL, NULL);
    if ( 0 == inBuffSize )
    {
        ERROR( "lpName has to be a valid parameter\n" );
        SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }

    inBuff = (CHAR *)PAL_malloc(inBuffSize);
    if (inBuff == NULL)
    {
        ERROR("malloc failed\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    
    if (nSize) {
        outBuff = (CHAR *)PAL_malloc(nSize*2);
        if (outBuff == NULL)
        {
            ERROR("malloc failed\n");
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
    }

    if ( 0 == WideCharToMultiByte( CP_ACP, 0, lpName, -1, inBuff, 
                                   inBuffSize, NULL, NULL ) )
    {
        ASSERT( "WideCharToMultiByte failed!\n" );
        SetLastError( ERROR_INTERNAL_ERROR );
        goto done;
    }
    size = GetEnvironmentVariableA(inBuff, outBuff, nSize);
    if (size > nSize)
    {
        TRACE("Insufficient buffer\n");
    }
    else if ( size == 0 )
    {
        /* error handle in GetEnvironmentVariableA */
    }
    else
    {
        size = MultiByteToWideChar(CP_ACP, 0, outBuff, -1, lpBuffer, nSize);
        if ( 0 != size )
        {
            /* Not including the NULL. */
            size--;
        }
        else
        {
            ASSERT( "MultiByteToWideChar failed!\n" );
            SetLastError( ERROR_INTERNAL_ERROR );
            size = 0;
            *lpBuffer = '\0';
        }
    }

done:
    PAL_free(outBuff);
    PAL_free(inBuff);

    LOGEXIT("GetEnvironmentVariableW returns DWORD 0x%x\n", size);
    PERF_EXIT(GetEnvironmentVariableW);
    return size;
}